

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  ImVec2 local_18;
  ImFontConfig *local_10;
  ImFontConfig *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->GlyphExtraSpacing);
  this->FontData = (void *)0x0;
  this->FontDataSize = 0;
  this->FontDataOwnedByAtlas = true;
  this->FontNo = 0;
  this->SizePixels = 0.0;
  this->OversampleH = 3;
  this->OversampleV = 1;
  this->PixelSnapH = false;
  ImVec2::ImVec2(&local_18,0.0,0.0);
  this->GlyphExtraSpacing = local_18;
  this->GlyphRanges = (ImWchar *)0x0;
  this->MergeMode = false;
  this->MergeGlyphCenterV = false;
  this->DstFont = (ImFont *)0x0;
  memset(this->Name,0,0x20);
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    FontData = NULL;
    FontDataSize = 0;
    FontDataOwnedByAtlas = true;
    FontNo = 0;
    SizePixels = 0.0f;
    OversampleH = 3;
    OversampleV = 1;
    PixelSnapH = false;
    GlyphExtraSpacing = ImVec2(0.0f, 0.0f);
    GlyphRanges = NULL;
    MergeMode = false;
    MergeGlyphCenterV = false;
    DstFont = NULL;
    memset(Name, 0, sizeof(Name));
}